

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O3

int32_t __thiscall
icu_63::UnicodeSetStringSpan::spanBackUTF8
          (UnicodeSetStringSpan *this,uint8_t *s,int32_t length,USetSpanCondition spanCondition)

{
  int32_t **ppiVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  UBool UVar5;
  uint length_00;
  int32_t iVar6;
  UChar32 c;
  UBool *pUVar7;
  byte *pbVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  uint8_t *puVar21;
  int iVar22;
  bool bVar23;
  int32_t oldPos;
  OffsetList offsets;
  uint local_ac;
  int local_94;
  ulong local_90;
  UnicodeSetStringSpan *local_88;
  UnicodeSet *local_80;
  long local_78;
  uint8_t *local_70;
  OffsetList local_68;
  ulong local_40;
  uint8_t *local_38;
  
  if (spanCondition == USET_SPAN_NOT_CONTAINED) {
    iVar6 = spanNotBackUTF8(this,s,length);
    return iVar6;
  }
  local_80 = &this->spanSet;
  length_00 = UnicodeSet::spanBackUTF8(local_80,(char *)s,length,USET_SPAN_CONTAINED);
  if (length_00 == 0) {
    uVar19 = 0;
  }
  else {
    local_68.list = local_68.staticList;
    local_68.capacity = 0;
    local_68.length = 0;
    local_68.start = 0;
    if (spanCondition == USET_SPAN_CONTAINED) {
      iVar9 = this->maxLength8;
      if ((long)iVar9 < 0x11) {
        local_68.capacity = 0x10;
        local_68.length = 0;
        iVar9 = 0x10;
      }
      else {
        pUVar7 = (UBool *)uprv_malloc_63((long)iVar9);
        if (pUVar7 == (UBool *)0x0) {
          iVar9 = local_68.capacity;
        }
        else {
          local_68.capacity = iVar9;
          local_68.list = pUVar7;
        }
      }
      memset(local_68.list,0,(long)iVar9);
    }
    local_ac = length - length_00;
    uVar19 = this->strings->count;
    uVar11 = (ulong)uVar19;
    lVar17 = 0;
    if (this->all != '\0') {
      lVar17 = (long)(int)uVar19 * 3;
    }
    local_38 = this->spanLengths + lVar17;
    local_88 = this;
    local_40 = uVar11;
LAB_00181e8e:
    do {
      pbVar8 = this->utf8;
      if (spanCondition == USET_SPAN_CONTAINED) {
        if (0 < (int)uVar11) {
          local_90 = (ulong)(length_00 + 1);
          local_70 = s + (int)length_00;
          local_78 = (long)(int)local_ac;
          uVar16 = 0;
          do {
            iVar9 = this->utf8Lengths[uVar16];
            lVar17 = (long)iVar9;
            if (lVar17 != 0) {
              bVar2 = local_38[uVar16];
              uVar19 = (uint)bVar2;
              if (bVar2 == 0xff) {
                pbVar8 = pbVar8 + lVar17;
              }
              else {
                if (bVar2 == 0xfe) {
                  uVar19 = 0xffffffff;
                  if ((iVar9 != 1) && (bVar2 = *pbVar8, 0xcc < (byte)(bVar2 + 0xb))) {
                    bVar3 = pbVar8[1];
                    if ((bVar2 & 0xf0) == 0xe0) {
                      if ((((byte)" 000000000000\x1000"[bVar2 & 0xf] >> (bVar3 >> 5) & 1) != 0) &&
                         (uVar19 = 0xfffffffe, iVar9 != 2)) {
                        uVar19 = (-0x41 < (char)pbVar8[2]) - 3;
                      }
                    }
                    else if (bVar2 < 0xe0) {
                      uVar19 = ~(uint)((char)bVar3 < -0x40);
                    }
                    else if ((((((byte)""[bVar3 >> 4] >> (bVar2 & 7) & 1) != 0) &&
                              (uVar19 = 0xfffffffe, iVar9 != 2)) && ((char)pbVar8[2] < -0x40)) &&
                            (uVar19 = 0xfffffffd, iVar9 != 3)) {
                      uVar19 = (char)pbVar8[3] < -0x40 ^ 0xfffffffd;
                    }
                  }
                  uVar19 = iVar9 + uVar19;
                }
                uVar20 = local_ac;
                if ((int)uVar19 < (int)local_ac) {
                  uVar20 = uVar19;
                }
                if ((int)(iVar9 - uVar20) <= (int)length_00) {
                  iVar22 = length_00 + 1 + uVar20;
                  uVar13 = local_ac;
                  if ((int)uVar19 < (int)local_ac) {
                    uVar13 = uVar19;
                  }
                  lVar15 = (long)(int)uVar19;
                  if (local_78 <= (int)uVar19) {
                    lVar15 = local_78;
                  }
                  lVar12 = (long)(int)(iVar9 - uVar20);
                  puVar21 = local_70 + (lVar15 - lVar17);
                  do {
                    if (-0x41 < (char)s[(int)length_00 - lVar12]) {
                      iVar14 = local_68.start + (uint)lVar12;
                      iVar6 = local_68.capacity;
                      if (iVar14 < local_68.capacity) {
                        iVar6 = 0;
                      }
                      iVar14 = iVar14 - iVar6;
                      if (local_68.list[iVar14] == '\0') {
                        lVar15 = 0;
                        iVar10 = iVar9 + 1;
                        do {
                          if (puVar21[lVar15] != pbVar8[lVar15]) goto LAB_0018207e;
                          lVar15 = lVar15 + 1;
                          iVar10 = iVar10 + -1;
                        } while (1 < iVar10);
                        if (length_00 == (uint)lVar12) goto LAB_00182345;
                        local_68.list[iVar14] = '\x01';
                        local_68.length = local_68.length + 1;
                      }
                    }
LAB_0018207e:
                    bVar23 = uVar20 == 0;
                    uVar20 = uVar20 - 1;
                    if (bVar23) break;
                    lVar12 = lVar12 + 1;
                    puVar21 = puVar21 + -1;
                  } while (iVar22 - uVar13 != (int)lVar12);
                }
                pbVar8 = pbVar8 + lVar17;
                this = local_88;
                uVar11 = local_40;
              }
            }
            uVar16 = uVar16 + 1;
          } while (uVar16 != uVar11);
        }
LAB_001821ea:
        if (length_00 == length || local_ac != 0) {
          uVar19 = length_00;
          if (local_68.length != 0) goto LAB_0018220c;
          break;
        }
        if (local_68.length != 0) {
          bVar2 = s[(long)(int)length_00 + -1];
          if ((char)bVar2 < '\0') {
            local_94 = length_00 - 1;
            c = utf8_prevCharSafeBody_63(s,0,&local_94,(uint)bVar2,-3);
            iVar22 = local_94;
            UVar5 = UnicodeSet::contains(local_80,c);
            iVar9 = -(length_00 - iVar22);
            if (UVar5 != '\0') {
              iVar9 = length_00 - iVar22;
            }
            if (0 < iVar9) goto LAB_001822fc;
          }
          else {
            UVar5 = UnicodeSet::contains(local_80,(uint)bVar2);
            iVar9 = 1;
            if (UVar5 != '\0') {
LAB_001822fc:
              length_00 = length_00 - iVar9;
              if (length_00 == 0) {
LAB_00182345:
                uVar19 = 0;
                break;
              }
              iVar6 = local_68.capacity;
              if (iVar9 + local_68.start < local_68.capacity) {
                iVar6 = 0;
              }
              local_68.start = (iVar9 + local_68.start) - iVar6;
              if (local_68.list[local_68.start] != '\0') {
                local_68.list[local_68.start] = '\0';
                local_68.length = local_68.length + -1;
              }
              local_ac = 0;
              goto LAB_00181e8e;
            }
          }
LAB_0018220c:
          iVar6 = OffsetList::popMinimum(&local_68);
          length_00 = length_00 - iVar6;
          local_ac = 0;
          goto LAB_00181e8e;
        }
        uVar19 = UnicodeSet::spanBackUTF8(local_80,(char *)s,length_00,USET_SPAN_CONTAINED);
        if (uVar19 == 0) break;
        uVar20 = length_00 - uVar19;
        length_00 = uVar19;
        local_ac = uVar20;
      }
      else {
        if ((int)uVar11 < 1) {
          bVar23 = true;
          iVar9 = 0;
        }
        else {
          ppiVar1 = &this->utf8Lengths;
          lVar17 = (long)(int)length_00;
          local_70 = s + lVar17;
          local_78 = (long)(int)local_ac;
          uVar18 = 0;
          uVar19 = 0;
          uVar16 = 0;
          do {
            uVar20 = (*ppiVar1)[uVar18];
            lVar15 = (long)(int)uVar20;
            if (lVar15 != 0) {
              uVar13 = uVar20;
              if (local_38[uVar18] < 0xfe) {
                uVar13 = (uint)local_38[uVar18];
              }
              uVar4 = local_ac;
              if ((int)uVar13 < (int)local_ac) {
                uVar4 = uVar13;
              }
              if (((int)(uVar20 - uVar4) <= (int)length_00) && ((int)uVar19 <= (int)uVar4)) {
                uVar11 = (ulong)(int)(uVar20 - uVar4);
                lVar12 = (long)(int)uVar13;
                if (local_78 <= (int)uVar13) {
                  lVar12 = local_78;
                }
                local_90 = CONCAT44(local_90._4_4_,(int)uVar16);
                puVar21 = local_70 + (lVar12 - lVar15);
                do {
                  if ((-0x41 < (char)s[lVar17 - uVar11]) &&
                     (((int)uVar19 < (int)uVar4 || ((long)(int)uVar16 < (long)uVar11)))) {
                    lVar12 = 0;
                    iVar9 = uVar20 + 1;
                    while (puVar21[lVar12] == pbVar8[lVar12]) {
                      lVar12 = lVar12 + 1;
                      iVar9 = iVar9 + -1;
                      if (iVar9 < 2) {
                        uVar16 = uVar11 & 0xffffffff;
                        this = local_88;
                        uVar19 = uVar4;
                        goto LAB_001821a8;
                      }
                    }
                  }
                  this = local_88;
                  if (lVar17 <= (long)uVar11) break;
                  uVar11 = uVar11 + 1;
                  puVar21 = puVar21 + -1;
                  bVar23 = (int)uVar19 < (int)uVar4;
                  uVar4 = uVar4 - 1;
                } while (bVar23);
              }
LAB_001821a8:
              pbVar8 = pbVar8 + lVar15;
              uVar11 = local_40;
            }
            iVar9 = (int)uVar16;
            uVar18 = uVar18 + 1;
          } while (uVar18 != uVar11);
          bVar23 = uVar19 == 0;
        }
        if ((iVar9 == 0) && (bVar23)) goto LAB_001821ea;
        local_ac = 0;
        uVar19 = 0;
        uVar20 = length_00 - iVar9;
        length_00 = uVar20;
      }
    } while (uVar20 != 0);
    OffsetList::~OffsetList(&local_68);
  }
  return uVar19;
}

Assistant:

int32_t UnicodeSetStringSpan::spanBackUTF8(const uint8_t *s, int32_t length, USetSpanCondition spanCondition) const {
    if(spanCondition==USET_SPAN_NOT_CONTAINED) {
        return spanNotBackUTF8(s, length);
    }
    int32_t pos=spanSet.spanBackUTF8((const char *)s, length, USET_SPAN_CONTAINED);
    if(pos==0) {
        return 0;
    }
    int32_t spanLength=length-pos;

    // Consider strings; they may overlap with the span.
    OffsetList offsets;
    if(spanCondition==USET_SPAN_CONTAINED) {
        // Use offset list to try all possibilities.
        offsets.setMaxLength(maxLength8);
    }
    int32_t i, stringsLength=strings.size();
    uint8_t *spanBackUTF8Lengths=spanLengths;
    if(all) {
        spanBackUTF8Lengths+=3*stringsLength;
    }
    for(;;) {
        const uint8_t *s8=utf8;
        int32_t length8;
        if(spanCondition==USET_SPAN_CONTAINED) {
            for(i=0; i<stringsLength; ++i) {
                length8=utf8Lengths[i];
                if(length8==0) {
                    continue;  // String not representable in UTF-8.
                }
                int32_t overlap=spanBackUTF8Lengths[i];
                if(overlap==ALL_CP_CONTAINED) {
                    s8+=length8;
                    continue;  // Irrelevant string.
                }

                // Try to match this string at pos-(length8-overlap)..pos-length8.
                if(overlap>=LONG_SPAN) {
                    overlap=length8;
                    // While contained: No point matching fully inside the code point span.
                    int32_t len1=0;
                    U8_FWD_1(s8, len1, overlap);
                    overlap-=len1;  // Length of the string minus the first code point.
                }
                if(overlap>spanLength) {
                    overlap=spanLength;
                }
                int32_t dec=length8-overlap;  // Keep dec+overlap==length8.
                for(;;) {
                    if(dec>pos) {
                        break;
                    }
                    // Try to match if the decrement is not listed already.
                    // Match at code point boundaries. (The UTF-8 strings were converted
                    // from UTF-16 and are guaranteed to be well-formed.)
                    if( !U8_IS_TRAIL(s[pos-dec]) &&
                        !offsets.containsOffset(dec) &&
                        matches8(s+pos-dec, s8, length8)
                    ) {
                        if(dec==pos) {
                            return 0;  // Reached the start of the string.
                        }
                        offsets.addOffset(dec);
                    }
                    if(overlap==0) {
                        break;
                    }
                    --overlap;
                    ++dec;
                }
                s8+=length8;
            }
        } else /* USET_SPAN_SIMPLE */ {
            int32_t maxDec=0, maxOverlap=0;
            for(i=0; i<stringsLength; ++i) {
                length8=utf8Lengths[i];
                if(length8==0) {
                    continue;  // String not representable in UTF-8.
                }
                int32_t overlap=spanBackUTF8Lengths[i];
                // For longest match, we do need to try to match even an all-contained string
                // to find the match from the latest end.

                // Try to match this string at pos-(length8-overlap)..pos-length8.
                if(overlap>=LONG_SPAN) {
                    overlap=length8;
                    // Longest match: Need to match fully inside the code point span
                    // to find the match from the latest end.
                }
                if(overlap>spanLength) {
                    overlap=spanLength;
                }
                int32_t dec=length8-overlap;  // Keep dec+overlap==length8.
                for(;;) {
                    if(dec>pos || overlap<maxOverlap) {
                        break;
                    }
                    // Try to match if the string is longer or ends later.
                    // Match at code point boundaries. (The UTF-8 strings were converted
                    // from UTF-16 and are guaranteed to be well-formed.)
                    if( !U8_IS_TRAIL(s[pos-dec]) &&
                        (overlap>maxOverlap || /* redundant overlap==maxOverlap && */ dec>maxDec) &&
                        matches8(s+pos-dec, s8, length8)
                    ) {
                        maxDec=dec;  // Longest match from latest end.
                        maxOverlap=overlap;
                        break;
                    }
                    --overlap;
                    ++dec;
                }
                s8+=length8;
            }

            if(maxDec!=0 || maxOverlap!=0) {
                // Longest-match algorithm, and there was a string match.
                // Simply continue before it.
                pos-=maxDec;
                if(pos==0) {
                    return 0;  // Reached the start of the string.
                }
                spanLength=0;  // Match strings from before a string match.
                continue;
            }
        }
        // Finished trying to match all strings at pos.

        if(spanLength!=0 || pos==length) {
            // The position is before an unlimited code point span (spanLength!=0),
            // not before a string match.
            // The only position where spanLength==0 before a span is pos==length.
            // Otherwise, an unlimited code point span is only tried again when no
            // strings match, and if such a non-initial span fails we stop.
            if(offsets.isEmpty()) {
                return pos;  // No strings matched before a span.
            }
            // Match strings from before the next string match.
        } else {
            // The position is before a string match (or a single code point).
            if(offsets.isEmpty()) {
                // No more strings matched before a previous string match.
                // Try another code point span from before the last string match.
                int32_t oldPos=pos;
                pos=spanSet.spanBackUTF8((const char *)s, oldPos, USET_SPAN_CONTAINED);
                spanLength=oldPos-pos;
                if( pos==0 ||           // Reached the start of the string, or
                    spanLength==0       // neither strings nor span progressed.
                ) {
                    return pos;
                }
                continue;  // spanLength>0: Match strings from before a span.
            } else {
                // Try to match only one code point from before a string match if some
                // string matched beyond it, so that we try all possible positions
                // and don't overshoot.
                spanLength=spanOneBackUTF8(spanSet, s, pos);
                if(spanLength>0) {
                    if(spanLength==pos) {
                        return 0;  // Reached the start of the string.
                    }
                    // Match strings before this code point.
                    // There cannot be any decrements below it because UnicodeSet strings
                    // contain multiple code points.
                    pos-=spanLength;
                    offsets.shift(spanLength);
                    spanLength=0;
                    continue;  // Match strings from before a single code point.
                }
                // Match strings from before the next string match.
            }
        }
        pos-=offsets.popMinimum();
        spanLength=0;  // Match strings from before a string match.
    }
}